

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

void Imf_3_3::copyFromFrameBuffer
               (char **writePtr,char **readPtr,char *endPtr,size_t xStride,Format format,
               PixelType type)

{
  undefined8 uVar1;
  ArgExc *this;
  long in_RCX;
  undefined2 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  int in_R9D;
  size_t i_1;
  size_t i;
  char *localReadPtr;
  char *localWritePtr;
  undefined4 in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  ArgExc *in_stack_ffffffffffffff80;
  ulong local_60;
  ulong local_58;
  undefined2 *local_38;
  undefined2 *local_30;
  
  local_30 = (undefined2 *)*in_RDI;
  local_38 = (undefined2 *)*in_RSI;
  if (in_R8D == 1) {
    if (in_R9D == 0) {
      for (; local_38 <= in_RDX; local_38 = (undefined2 *)(in_RCX + (long)local_38)) {
        Xdr::write<Imf_3_3::CharPtrIO,char*>
                  ((char **)in_stack_ffffffffffffff80,(uint)in_stack_ffffffffffffff7c);
      }
    }
    else if (in_R9D == 1) {
      for (; local_38 <= in_RDX; local_38 = (undefined2 *)(in_RCX + (long)local_38)) {
        Xdr::write<Imf_3_3::CharPtrIO,char*>
                  ((char **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (half)(uint16_t)((ulong)in_stack_ffffffffffffff80 >> 0x30));
      }
    }
    else {
      if (in_R9D != 2) {
        uVar1 = __cxa_allocate_exception(0x48);
        Iex_3_3::ArgExc::ArgExc
                  (in_stack_ffffffffffffff80,
                   (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        __cxa_throw(uVar1,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
      }
      for (; local_38 <= in_RDX; local_38 = (undefined2 *)(in_RCX + (long)local_38)) {
        Xdr::write<Imf_3_3::CharPtrIO,char*>
                  ((char **)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      }
    }
  }
  else if (in_R9D == 0) {
    for (; local_38 <= in_RDX; local_38 = (undefined2 *)(in_RCX + (long)local_38)) {
      for (local_58 = 0; local_58 < 4; local_58 = local_58 + 1) {
        *(undefined1 *)local_30 = *(undefined1 *)((long)local_38 + local_58);
        local_30 = (undefined2 *)((long)local_30 + 1);
      }
    }
  }
  else if (in_R9D == 1) {
    for (; local_38 <= in_RDX; local_38 = (undefined2 *)(in_RCX + (long)local_38)) {
      *local_30 = *local_38;
      local_30 = local_30 + 1;
    }
  }
  else {
    if (in_R9D != 2) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc
                (this,(char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      __cxa_throw(this,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    for (; local_38 <= in_RDX; local_38 = (undefined2 *)(in_RCX + (long)local_38)) {
      for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
        *(undefined1 *)local_30 = *(undefined1 *)((long)local_38 + local_60);
        local_30 = (undefined2 *)((long)local_30 + 1);
      }
    }
  }
  *in_RDI = local_30;
  *in_RSI = local_38;
  return;
}

Assistant:

void
copyFromFrameBuffer (
    char*&             writePtr,
    const char*&       readPtr,
    const char*        endPtr,
    size_t             xStride,
    Compressor::Format format,
    PixelType          type)
{
    char*       localWritePtr = writePtr;
    const char* localReadPtr  = readPtr;
    //
    // Copy a horizontal row of pixels from a frame
    // buffer to an output file's line or tile buffer.
    //

    if (format == Compressor::XDR)
    {
        //
        // The line or tile buffer is in XDR format.
        //

        switch (type)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (localReadPtr <= endPtr)
                {
                    Xdr::write<CharPtrIO> (
                        localWritePtr, *(const unsigned int*) localReadPtr);
                    localReadPtr += xStride;
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                while (localReadPtr <= endPtr)
                {
                    Xdr::write<CharPtrIO> (
                        localWritePtr, *(const half*) localReadPtr);
                    localReadPtr += xStride;
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (localReadPtr <= endPtr)
                {
                    Xdr::write<CharPtrIO> (
                        localWritePtr, *(const float*) localReadPtr);
                    localReadPtr += xStride;
                }
                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The line or tile buffer is in NATIVE format.
        //

        switch (type)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                while (localReadPtr <= endPtr)
                {
                    for (size_t i = 0; i < sizeof (unsigned int); ++i)
                        *localWritePtr++ = localReadPtr[i];

                    localReadPtr += xStride;
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                while (localReadPtr <= endPtr)
                {
                    *(half*) localWritePtr = *(const half*) localReadPtr;
                    localWritePtr += sizeof (half);
                    localReadPtr += xStride;
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                while (localReadPtr <= endPtr)
                {
                    for (size_t i = 0; i < sizeof (float); ++i)
                        *localWritePtr++ = localReadPtr[i];

                    localReadPtr += xStride;
                }
                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }

    writePtr = localWritePtr;
    readPtr  = localReadPtr;
}